

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::handle_key(Plotter *this,int key,bool ctrl,bool shift,bool alt)

{
  byte in_CL;
  byte in_DL;
  int in_ESI;
  Plotter *in_RDI;
  byte in_R8B;
  bool bVar1;
  double dVar2;
  double dx;
  double dy;
  double fa;
  double delta_1;
  double delta;
  double local_58;
  double local_38;
  double local_30;
  double local_20;
  double local_18;
  
  if (in_ESI == 0x25) {
LAB_00141e21:
    local_18 = ((in_RDI->view).xmax - (in_RDI->view).xmin) * 0.003 * 1.0;
    if ((in_ESI == 0x25) || (in_ESI == 0x107)) {
      local_18 = -local_18;
    }
    (in_RDI->view).xmin = local_18 + (in_RDI->view).xmin;
    (in_RDI->view).xmax = local_18 + (in_RDI->view).xmax;
    in_RDI->require_update = true;
  }
  else {
    if (in_ESI != 0x26) {
      if (in_ESI == 0x27) goto LAB_00141e21;
      if (in_ESI != 0x28) {
        if (in_ESI == 0x2d) {
LAB_00141f45:
          bVar1 = true;
          if ((in_ESI != 0x2d) && (bVar1 = true, in_ESI != 0xbd)) {
            bVar1 = in_ESI == 0xad;
          }
          local_58 = 1.0;
          if (!bVar1) {
            local_58 = -1.0;
          }
          dVar2 = local_58 * 0.013 + 1.0;
          local_30 = (((in_RDI->view).ymax - (in_RDI->view).ymin) * (dVar2 - 1.0)) / 2.0;
          local_38 = (((in_RDI->view).xmax - (in_RDI->view).xmin) * (dVar2 - 1.0)) / 2.0;
          if ((in_CL & 1) != 0) {
            local_30 = 0.0;
          }
          if ((in_R8B & 1) != 0) {
            local_38 = 0.0;
          }
          (in_RDI->view).xmin = (in_RDI->view).xmin - local_38;
          (in_RDI->view).xmax = local_38 + (in_RDI->view).xmax;
          (in_RDI->view).ymin = (in_RDI->view).ymin - local_30;
          (in_RDI->view).ymax = local_30 + (in_RDI->view).ymax;
          in_RDI->require_update = true;
          return;
        }
        if (in_ESI == 0x30) {
LAB_001420a4:
          if ((in_DL & 1) == 0) {
            return;
          }
          reset_view(in_RDI);
          return;
        }
        if (in_ESI == 0x3d) goto LAB_00141f45;
        if (in_ESI == 0x45) {
          in_RDI->focus_on_editor = true;
          return;
        }
        if (in_ESI == 0x48) goto LAB_001420a4;
        if (in_ESI == 0x4f) {
          if ((in_RDI->polar_grid & 1U) == 0) {
            return;
          }
          in_RDI->polar_grid = false;
          in_RDI->require_update = true;
          return;
        }
        if (in_ESI == 0x50) {
          if ((in_RDI->polar_grid & 1U) != 0) {
            return;
          }
          in_RDI->polar_grid = true;
          in_RDI->require_update = true;
          return;
        }
        if (((in_ESI == 0xad) || (in_ESI == 0xbb)) || (in_ESI == 0xbd)) goto LAB_00141f45;
        if (in_ESI - 0x106U < 2) goto LAB_00141e21;
        if (1 < in_ESI - 0x108U) {
          return;
        }
      }
    }
    local_20 = ((in_RDI->view).ymax - (in_RDI->view).ymin) * 0.003 * 1.0;
    if ((in_ESI == 0x28) || (in_ESI == 0x108)) {
      local_20 = -local_20;
    }
    (in_RDI->view).ymin = local_20 + (in_RDI->view).ymin;
    (in_RDI->view).ymax = local_20 + (in_RDI->view).ymax;
    in_RDI->require_update = true;
  }
  return;
}

Assistant:

void Plotter::handle_key(int key, bool ctrl, bool shift, bool alt) {
#ifdef NIVALIS_EMSCRIPTEN
    static const double scale = 2.0;
#else
    static const double scale = 1.0;
#endif
    switch(key) {
        case 37: case 39: case 262: case 263:
            // LR Arrow
            {
                auto delta = (view.xmax - view.xmin) * 0.003 * scale;
                if (key == 37 || key == 263) delta = -delta;
                view.xmin += delta; view.xmax += delta;
            }
            require_update = true;
            break;
        case 38: case 40: case 264: case 265:
            {
                // UD Arrow
                auto delta = (view.ymax - view.ymin) * 0.003 * scale;
                if (key == 40 || key == 264) delta = -delta;
                view.ymin += delta; view.ymax += delta;
            }
            require_update = true;
            break;
        case 61: case 45:
        case 187: case 189:
        case 173:
            // Zooming +-
            {
                auto fa = 1 + 0.013 * ((key == 45 || key == 189 ||
                            key == 173) ? scale : -scale);
                auto dy = (view.ymax - view.ymin) * (fa - 1.) /2;
                auto dx = (view.xmax - view.xmin) * (fa - 1.) /2;
                if (shift) dy = 0.; // x-only
                if (alt) dx = 0.;  // y-only
                view.xmin -= dx; view.xmax += dx;
                view.ymin -= dy; view.ymax += dy;
                require_update = true;
            }
            break;
        case 48: case 72:
            // ctrl 0/H: Home
            if (ctrl) {
                reset_view();
            }
            break;
        case 80:
            // P: Polar grid
            if (!polar_grid) {
                polar_grid = true;
                require_update = true;
            }
            break;
        case 79:
            // O: Cartesian grid
            if (polar_grid) {
                polar_grid = false;
                require_update = true;
            }
            break;
        case 69:
            // E: Edit (focus editor)
            focus_on_editor = true;
            break;
    }
}